

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void sat_solver2_setnvars(sat_solver2 *s,int n)

{
  int iVar1;
  veci *pvVar2;
  varinfo2 *pvVar3;
  int *piVar4;
  char *pcVar5;
  lit *plVar6;
  cla *pcVar7;
  uint *puVar8;
  long lVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  
  iVar1 = s->cap;
  if (iVar1 < n) {
    iVar10 = iVar1;
    while (iVar10 < n) {
      iVar10 = iVar10 * 2 + 1;
      s->cap = iVar10;
    }
    sVar11 = (long)(iVar10 * 2) << 4;
    if (s->wlists == (veci *)0x0) {
      pvVar2 = (veci *)malloc(sVar11);
    }
    else {
      pvVar2 = (veci *)realloc(s->wlists,sVar11);
    }
    s->wlists = pvVar2;
    sVar11 = (long)s->cap << 2;
    if (s->vi == (varinfo2 *)0x0) {
      pvVar3 = (varinfo2 *)malloc(sVar11);
    }
    else {
      pvVar3 = (varinfo2 *)realloc(s->vi,sVar11);
    }
    s->vi = pvVar3;
    sVar11 = (long)s->cap << 2;
    if (s->levels == (int *)0x0) {
      piVar4 = (int *)malloc(sVar11);
    }
    else {
      piVar4 = (int *)realloc(s->levels,sVar11);
    }
    s->levels = piVar4;
    if (s->assigns == (char *)0x0) {
      pcVar5 = (char *)malloc((long)s->cap);
    }
    else {
      pcVar5 = (char *)realloc(s->assigns,(long)s->cap);
    }
    s->assigns = pcVar5;
    sVar11 = (long)s->cap << 2;
    if (s->trail == (lit *)0x0) {
      plVar6 = (lit *)malloc(sVar11);
    }
    else {
      plVar6 = (lit *)realloc(s->trail,sVar11);
    }
    s->trail = plVar6;
    sVar11 = (long)s->cap << 2;
    if (s->orderpos == (int *)0x0) {
      piVar4 = (int *)malloc(sVar11);
    }
    else {
      piVar4 = (int *)realloc(s->orderpos,sVar11);
    }
    s->orderpos = piVar4;
    sVar11 = (long)s->cap << 2;
    if (s->reasons == (cla *)0x0) {
      pcVar7 = (cla *)malloc(sVar11);
    }
    else {
      pcVar7 = (cla *)realloc(s->reasons,sVar11);
    }
    s->reasons = pcVar7;
    if (s->fProofLogging != 0) {
      sVar11 = (long)s->cap << 2;
      if (s->units == (cla *)0x0) {
        pcVar7 = (cla *)malloc(sVar11);
      }
      else {
        pcVar7 = (cla *)realloc(s->units,sVar11);
      }
      s->units = pcVar7;
    }
    sVar11 = (long)s->cap << 2;
    if (s->activity == (uint *)0x0) {
      puVar8 = (uint *)malloc(sVar11);
    }
    else {
      puVar8 = (uint *)realloc(s->activity,sVar11);
    }
    s->activity = puVar8;
    sVar11 = (long)s->cap << 2;
    if (s->activity2 == (uint *)0x0) {
      puVar8 = (uint *)malloc(sVar11);
    }
    else {
      puVar8 = (uint *)realloc(s->activity2,sVar11);
    }
    s->activity2 = puVar8;
    iVar10 = s->cap;
    if (s->model == (int *)0x0) {
      piVar4 = (int *)malloc((long)iVar10 * 4);
    }
    else {
      piVar4 = (int *)realloc(s->model,(long)iVar10 * 4);
      iVar10 = s->cap;
    }
    s->model = piVar4;
    memset(s->wlists + (long)iVar1 * 2,0,(long)((iVar10 - iVar1) * 2) << 4);
  }
  iVar1 = s->size;
  lVar13 = (long)iVar1;
  uVar12 = lVar13 << 5 | 0x10;
  lVar9 = 0;
  while( true ) {
    if ((long)n <= lVar13 + lVar9) {
      if (n < s->size) {
        n = s->size;
      }
      s->size = n;
      return;
    }
    pvVar2 = s->wlists;
    if (*(int *)((long)pvVar2 + (uVar12 - 0xc)) != 0) break;
    if (*(int *)((long)&pvVar2->size + uVar12) != 0) {
      __assert_fail("!s->wlists[2*var+1].size",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x4af,"void sat_solver2_setnvars(sat_solver2 *, int)");
    }
    if (*(long *)((long)pvVar2 + (uVar12 - 8)) == 0) {
      veci_new((veci *)((long)&pvVar2[-1].cap + uVar12));
      pvVar2 = s->wlists;
    }
    if (*(long *)((long)&pvVar2->ptr + uVar12) == 0) {
      veci_new((veci *)((long)&pvVar2->cap + uVar12));
    }
    s->vi[lVar13 + lVar9] = (varinfo2)0x0;
    s->levels[lVar13 + lVar9] = 0;
    s->assigns[lVar9 + lVar13] = '\x03';
    s->reasons[lVar13 + lVar9] = 0;
    if (s->fProofLogging != 0) {
      s->units[lVar13 + lVar9] = 0;
    }
    s->activity[lVar13 + lVar9] = 0x400;
    s->model[lVar13 + lVar9] = 0;
    s->orderpos[lVar13 + lVar9] = (s->order).size;
    iVar10 = iVar1 + (int)lVar9;
    veci_push(&s->order,iVar10);
    order_update(s,iVar10);
    uVar12 = uVar12 + 0x20;
    lVar9 = lVar9 + 1;
  }
  __assert_fail("!s->wlists[2*var].size",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                ,0x4ae,"void sat_solver2_setnvars(sat_solver2 *, int)");
}

Assistant:

void sat_solver2_setnvars(sat_solver2* s,int n)
{
    int var;

    if (s->cap < n){
        int old_cap = s->cap;
        while (s->cap < n) s->cap = s->cap*2+1;

        s->wlists    = ABC_REALLOC(veci,     s->wlists,   s->cap*2);
        s->vi        = ABC_REALLOC(varinfo2, s->vi,       s->cap);
        s->levels    = ABC_REALLOC(int,      s->levels,   s->cap);
        s->assigns   = ABC_REALLOC(char,     s->assigns,  s->cap);
        s->trail     = ABC_REALLOC(lit,      s->trail,    s->cap);
        s->orderpos  = ABC_REALLOC(int,      s->orderpos, s->cap);
        s->reasons   = ABC_REALLOC(cla,      s->reasons,  s->cap);
        if ( s->fProofLogging )
        s->units     = ABC_REALLOC(cla,      s->units,    s->cap);
#ifdef USE_FLOAT_ACTIVITY2
        s->activity  = ABC_REALLOC(double,   s->activity, s->cap);
#else
        s->activity  = ABC_REALLOC(unsigned, s->activity, s->cap);
        s->activity2 = ABC_REALLOC(unsigned, s->activity2,s->cap);
#endif
        s->model     = ABC_REALLOC(int,      s->model,    s->cap);
        memset( s->wlists + 2*old_cap, 0, 2*(s->cap-old_cap)*sizeof(vecp) );
    }

    for (var = s->size; var < n; var++){
        assert(!s->wlists[2*var].size);
        assert(!s->wlists[2*var+1].size);
        if ( s->wlists[2*var].ptr == NULL )
            veci_new(&s->wlists[2*var]);
        if ( s->wlists[2*var+1].ptr == NULL )
            veci_new(&s->wlists[2*var+1]);
        *((int*)s->vi + var) = 0; //s->vi[var].val = varX;
        s->levels  [var] = 0;
        s->assigns [var] = varX;
        s->reasons [var] = 0;
        if ( s->fProofLogging )
        s->units   [var] = 0;
#ifdef USE_FLOAT_ACTIVITY2
        s->activity[var] = 0;
#else
        s->activity[var] = (1<<10);
#endif
        s->model   [var] = 0;
        // does not hold because variables enqueued at top level will not be reinserted in the heap
        // assert(veci_size(&s->order) == var); 
        s->orderpos[var] = veci_size(&s->order);
        veci_push(&s->order,var);
        order_update(s, var);
    }
    s->size = n > s->size ? n : s->size;
}